

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

Transaction * __thiscall
cfd::core::Block::GetTransaction(Transaction *__return_storage_ptr__,Block *this,Txid *txid)

{
  size_t this_00;
  bool bVar1;
  string *psVar2;
  const_reference txid_00;
  const_reference byte_data;
  undefined8 uVar3;
  string *message;
  CfdError error_code;
  Transaction *this_01;
  allocator local_49;
  string local_48 [32];
  string *local_28;
  size_t index;
  Txid *txid_local;
  Block *this_local;
  
  local_28 = (string *)0x0;
  this_01 = __return_storage_ptr__;
  index = (size_t)txid;
  txid_local = (Txid *)this;
  this_local = (Block *)__return_storage_ptr__;
  while( true ) {
    message = local_28;
    psVar2 = (string *)
             ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::size(&this->txids_);
    this_00 = index;
    if (psVar2 <= message) {
      uVar3 = __cxa_allocate_exception(0x30);
      error_code = (CfdError)((ulong)__return_storage_ptr__ >> 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_48,"target txid not found.",&local_49);
      CfdException::CfdException((CfdException *)this_01,error_code,message);
      __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    txid_00 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator[]
                        (&this->txids_,(size_type)local_28);
    bVar1 = Txid::Equals((Txid *)this_00,txid_00);
    if (bVar1) break;
    local_28 = (string *)&local_28->field_0x1;
  }
  byte_data = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&this->txs_,(size_type)local_28);
  Transaction::Transaction(__return_storage_ptr__,byte_data);
  return this_01;
}

Assistant:

Transaction Block::GetTransaction(const Txid& txid) const {
  for (size_t index = 0; index < txids_.size(); ++index) {
    if (txid.Equals(txids_[index])) {
      return Transaction(txs_[index]);
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "target txid not found.");
}